

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

size_t google::protobuf::internal::WireFormatLite::SInt32Size(RepeatedField<int> *value)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  uVar5 = value->current_size_;
  lVar1 = (long)(int)uVar5;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      iVar3 = *(int *)((long)value->arena_or_elements_ + lVar4 * 4);
      uVar2 = iVar3 >> 0x1f ^ iVar3 * 2;
      auVar6._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar2 ^ 0x80000000));
      auVar6._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar2 ^ 0x80000000));
      auVar6._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar2 ^ 0x80000000));
      auVar6._12_4_ = -(uint)(-0x70000001 < (int)(uVar2 ^ 0x80000000));
      iVar3 = movmskps(uVar2,auVar6);
      uVar5 = uVar5 + ((uint)(0x4332322132212110 >> ((byte)(iVar3 << 2) & 0x3f)) & 7);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return (ulong)uVar5;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}